

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_get_uid(uchar **p,uchar *end,mbedtls_x509_buf *uid,int n)

{
  int ret;
  int n_local;
  mbedtls_x509_buf *uid_local;
  uchar *end_local;
  uchar **p_local;
  
  if (*p == end) {
    p_local._4_4_ = 0;
  }
  else {
    uid->tag = (uint)**p;
    p_local._4_4_ = mbedtls_asn1_get_tag(p,end,&uid->len,n | 0xa0);
    if (p_local._4_4_ == 0) {
      uid->p = *p;
      *p = *p + uid->len;
      p_local._4_4_ = 0;
    }
    else if (p_local._4_4_ == -0x62) {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int x509_get_uid( unsigned char **p,
                         const unsigned char *end,
                         mbedtls_x509_buf *uid, int n )
{
    int ret;

    if( *p == end )
        return( 0 );

    uid->tag = **p;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &uid->len,
            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | n ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
            return( 0 );

        return( ret );
    }

    uid->p = *p;
    *p += uid->len;

    return( 0 );
}